

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MQTT.hpp
# Opt level: O2

void __thiscall
Protocol::MQTT::V5::ControlPacket<(Protocol::MQTT::Common::ControlPacketType)10,_false>::
ControlPacket(ControlPacket<(Protocol::MQTT::Common::ControlPacketType)10,_false> *this)

{
  (this->super_ControlPacketSerializableImpl).super_ControlPacketSerializable.super_Serializable.
  _vptr_Serializable = (_func_int **)&PTR_getSize_00125768;
  ControlPacketSerializableImpl::ControlPacketSerializableImpl
            (&this->super_ControlPacketSerializableImpl,&(this->header).super_FixedHeaderBase,
             (FixedFieldGeneric *)&this->fixedVariableHeader,
             &(this->props).super_SerializableProperties,&(this->payload).super_SerializablePayload)
  ;
  (this->super_ControlPacketSerializableImpl).super_ControlPacketSerializable.super_Serializable.
  _vptr_Serializable = (_func_int **)&PTR_getSize_00125768;
  (this->header).super_FixedHeaderBase.typeAndFlags = 0xa2;
  (this->header).super_FixedHeaderBase._vptr_FixedHeaderBase = (_func_int **)&PTR_getType_001257c0;
  (this->fixedVariableHeader).super_FixedFieldWithID.super_FixedFieldGeneric.value =
       &(this->fixedVariableHeader).super_FixedFieldWithID.packetID.super_GenericTypeBase;
  (this->fixedVariableHeader).super_FixedFieldWithID.packetID.super_GenericTypeBase.
  _vptr_GenericTypeBase = (_func_int **)&PTR_typeSize_001245e8;
  (this->fixedVariableHeader).super_FixedFieldWithID.packetID.value = 0;
  (this->fixedVariableHeader).super_FixedFieldWithID.super_FixedFieldGeneric.super_Serializable.
  _vptr_Serializable = (_func_int **)&PTR_getSize_00125808;
  Properties::Properties(&this->props);
  (this->payload).super_SerializablePayload.super_EmptySerializable.super_Serializable.
  _vptr_Serializable = (_func_int **)&PTR_getSize_00125868;
  (this->payload).topics = (UnsubscribeTopic *)0x0;
  (this->payload).expSize = 0;
  return;
}

Assistant:

ControlPacket() : ControlPacketSerializableImpl(header, fixedVariableHeader, props, payload)
                {
                    payload.setFlags(fixedVariableHeader); fixedVariableHeader.setFlags(header.typeAndFlags);
                }